

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  int iVar1;
  ui_entry_combiner_state_conflict *extraout_RDX;
  ui_entry_combiner_state_conflict *extraout_RDX_00;
  wchar_t wVar2;
  int local_c0;
  int local_b8;
  int local_b4;
  int local_ac;
  undefined1 local_a8 [8];
  ui_entry_combiner_state_conflict cst_1;
  wchar_t palette_index_1;
  int local_8c;
  undefined1 local_88 [4];
  wchar_t palette_index;
  ui_entry_combiner_state_conflict cst;
  wchar_t local_70;
  wchar_t i;
  wchar_t ac;
  wchar_t vc;
  ui_entry_combiner_funcs_conflict combiner;
  wchar_t wStack_40;
  wchar_t color_offset;
  loc_conflict p;
  ui_entry_details *details_local;
  wchar_t n_local;
  wchar_t *auxvals_local;
  wchar_t *vals_local;
  wchar_t nlabel_local;
  wchar_t *label_local;
  
  _wStack_40 = details->value_position;
  combiner.vec_func._4_4_ = 0;
  if ((details->alternate_color_first & 1U) != 0) {
    combiner.vec_func._4_4_ = 7;
  }
  if (((L'\x15' < info->ncolors) && (L'\t' < info->nlabcolors)) && (L'\n' < info->nsym)) {
    iVar1 = ui_entry_combiner_get_funcs(info->combiner_index,(ui_entry_combiner_funcs *)&ac);
    if (iVar1 == 0) {
      for (cst.accum_aux = L'\0'; cst.accum_aux < n; cst.accum_aux = cst.accum_aux + L'\x01') {
        (*_ac)(vals[cst.accum_aux],0,(ui_entry_combiner_state *)local_88);
        wVar2 = L'\0';
        (*combiner.init_func)
                  (auxvals[cst.accum_aux],L'\0',(ui_entry_combiner_state_conflict *)local_88);
        (*combiner.accum_func)((wchar_t)local_88,wVar2,extraout_RDX);
        if ((vals[cst.accum_aux] == L'\x7fffffff') ||
           ((vals[cst.accum_aux] == L'\0' && (auxvals[cst.accum_aux] == L'\x7fffffff')))) {
          local_8c = 0;
        }
        else if ((int)cst.work == 0x7ffffffe) {
          local_8c = 1;
        }
        else {
          if ((int)cst.work < 1) {
            local_ac = 2;
            if ((int)cst.work < 0) {
              local_ac = 8;
            }
          }
          else {
            local_ac = 5;
          }
          if (auxvals[cst.accum_aux] < L'\x01') {
            local_b4 = 0;
            if (auxvals[cst.accum_aux] < L'\0') {
              local_b4 = 2;
            }
          }
          else {
            local_b4 = 1;
          }
          local_8c = local_ac + local_b4;
        }
        Term_putch(wStack_40,color_offset,info->colors[(int)(local_8c + combiner.vec_func._4_4_)],
                   info->symbols[local_8c]);
        register0x00000000 = (loc_conflict)loc_sum((loc)_wStack_40,(loc)details->position_step);
        combiner.vec_func._4_4_ = combiner.vec_func._4_4_ ^ 0xb;
        _wStack_40 = register0x00000000;
      }
      if ((L'\0' < nlabel) || ((details->show_combined & 1U) != 0)) {
        (*combiner.finish_func)((ui_entry_combiner_state_conflict *)(ulong)(uint)n);
        if (L'\0' < nlabel) {
          if ((details->known_rune & 1U) == 0) {
            cst_1.accum = L'\0';
          }
          else {
            (*_ac)(i,0,(ui_entry_combiner_state *)local_a8);
            wVar2 = L'\0';
            (*combiner.init_func)(local_70,L'\0',(ui_entry_combiner_state_conflict *)local_a8);
            (*combiner.accum_func)((wchar_t)local_a8,wVar2,extraout_RDX_00);
            if (((int)cst_1.work == 0x7fffffff) || ((int)cst_1.work == 0x7ffffffe)) {
              cst_1.accum = L'\x01';
            }
            else {
              if ((int)cst_1.work < 1) {
                local_b8 = 1;
                if ((int)cst_1.work < 0) {
                  local_b8 = 7;
                }
              }
              else {
                local_b8 = 4;
              }
              if (local_70 < L'\x01') {
                local_c0 = 0;
                if (local_70 < L'\0') {
                  local_c0 = 2;
                }
              }
              else {
                local_c0 = 1;
              }
              cst_1.accum = local_b8 + local_c0;
            }
          }
          if ((details->vertical_label & 1U) == 0) {
            safe_queue_chars((details->label_position).x,(details->label_position).y,nlabel,
                             info->label_colors[cst_1.accum],label);
          }
          else {
            _wStack_40 = details->label_position;
            for (cst.accum_aux = L'\0'; cst.accum_aux < nlabel;
                cst.accum_aux = cst.accum_aux + L'\x01') {
              Term_putch(wStack_40,color_offset,info->label_colors[cst_1.accum],label[cst.accum_aux]
                        );
              color_offset = color_offset + L'\x01';
            }
          }
        }
        if ((details->show_combined & 1U) != 0) {
          show_combined_generic(info,details,i,local_70);
        }
      }
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                  ,0x43f,
                  "void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                 );
  }
  __assert_fail("info->ncolors >= 22 && info->nlabcolors >= 10 && info->nsym >= 11",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                ,0x43c,
                "void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 22 && info->nlabcolors >= 10
		&& info->nsym >= 11);

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}

	for (i = 0; i < n; ++i) {
		struct ui_entry_combiner_state cst;
		int palette_index;

		(*combiner.init_func)(vals[i], 0, &cst);
		(*combiner.accum_func)(auxvals[i], 0, &cst);
		(*combiner.finish_func)(&cst);
		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE || (vals[i] == 0
				&& auxvals[i] == UI_ENTRY_UNKNOWN_VALUE)) {
			palette_index = 0;
		} else if (cst.accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
		} else {
			palette_index =
				((cst.accum > 0) ?
					5 : ((cst.accum < 0) ? 8 : 2))
				+ ((auxvals[i] > 0) ?
					1 : ((auxvals[i] < 0) ? 2 : 0));
		}
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 11;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index;

		if (!details->known_rune) {
			palette_index = 0;
		} else {
			struct ui_entry_combiner_state cst;

			(*combiner.init_func)(vc, 0, &cst);
			(*combiner.accum_func)(ac, 0, &cst);
			(*combiner.finish_func)(&cst);
			if (cst.accum == UI_ENTRY_UNKNOWN_VALUE
					|| cst.accum == UI_ENTRY_VALUE_NOT_PRESENT) {
				palette_index = 1;
			} else {
				palette_index =
					((cst.accum > 0) ? 4 :
						((cst.accum < 0) ? 7 : 1))
					+ ((ac > 0) ? 1 : ((ac < 0) ? 2 : 0));
			}
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}